

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O3

int32_t __thiscall icu_63::Package::findItem(Package *this,char *name,int32_t length)

{
  uint uVar1;
  char *__s2;
  bool bVar2;
  int iVar3;
  Item *pIVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar6 = this->itemCount;
  if ((int)uVar6 < 1) {
    return -1;
  }
  pIVar4 = this->items;
  uVar8 = 0;
  while( true ) {
    uVar1 = uVar6 + uVar8;
    uVar7 = uVar1 >> 1;
    __s2 = pIVar4[uVar7].name;
    if (length < 0) {
      iVar3 = strcmp(name,__s2);
    }
    else {
      iVar3 = strncmp(name,__s2,(ulong)(uint)length);
    }
    if (iVar3 == 0) break;
    if (-1 < iVar3) {
      uVar8 = uVar7 + 1;
      uVar7 = uVar6;
    }
    uVar6 = uVar7;
    if ((int)uVar6 <= (int)uVar8) {
      return ~uVar8;
    }
  }
  if (length < 0) {
    return uVar7;
  }
  if (1 < uVar1) {
    pIVar4 = pIVar4 + (uVar1 >> 1);
    uVar5 = (ulong)(uVar1 >> 1);
    do {
      pIVar4 = pIVar4 + -1;
      iVar3 = strncmp(name,pIVar4->name,(ulong)(uint)length);
      if (iVar3 != 0) {
        return (int32_t)uVar5;
      }
      bVar2 = 1 < (long)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar2);
    return 0;
  }
  return uVar7;
}

Assistant:

int32_t
Package::findItem(const char *name, int32_t length) const {
    int32_t i, start, limit;
    int result;

    /* do a binary search for the string */
    start=0;
    limit=itemCount;
    while(start<limit) {
        i=(start+limit)/2;
        if(length>=0) {
            result=strncmp(name, items[i].name, length);
        } else {
            result=strcmp(name, items[i].name);
        }

        if(result==0) {
            /* found */
            if(length>=0) {
                /*
                 * if we compared just prefixes, then we may need to back up
                 * to the first item with this prefix
                 */
                while(i>0 && 0==strncmp(name, items[i-1].name, length)) {
                    --i;
                }
            }
            return i;
        } else if(result<0) {
            limit=i;
        } else /* result>0 */ {
            start=i+1;
        }
    }

    return ~start; /* not found, return binary-not of the insertion point */
}